

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O0

void __thiscall TCPConnection::StoreRxData(TCPConnection *this,DataBuffer *buffer)

{
  uint8_t uVar1;
  ushort uVar2;
  ushort local_1a;
  uint16_t i;
  DataBuffer *buffer_local;
  TCPConnection *this_local;
  
  if (this->CurrentWindow < buffer->Length) {
    printf("Rx window overrun, buffer %d, window %d\n",(ulong)buffer->Length,
           (ulong)this->CurrentWindow);
  }
  else {
    for (local_1a = 0; local_1a < buffer->Length; local_1a = local_1a + 1) {
      uVar1 = buffer->Packet[local_1a];
      uVar2 = this->RxInOffset;
      this->RxInOffset = uVar2 + 1;
      this->RxBuffer[uVar2] = uVar1;
      if (0xff < this->RxInOffset) {
        this->RxInOffset = 0;
      }
    }
    this->CurrentWindow = this->CurrentWindow - buffer->Length;
    this->RxBufferEmpty = false;
  }
  return;
}

Assistant:

void TCPConnection::StoreRxData(DataBuffer* buffer)
{
    uint16_t i;

    if (buffer->Length > CurrentWindow)
    {
        printf("Rx window overrun, buffer %d, window %d\n", buffer->Length, CurrentWindow);
        return;
    }

    for (i = 0; i < buffer->Length; i++)
    {
        RxBuffer[RxInOffset++] = buffer->Packet[i];
        if (RxInOffset >= TCP_RX_WINDOW_SIZE)
        {
            RxInOffset = 0;
        }
    }
    CurrentWindow -= buffer->Length;
    RxBufferEmpty = false;
}